

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::TableBinding::Bind
          (BindResult *__return_storage_ptr__,TableBinding *this,ColumnRefExpression *colref,
          idx_t depth)

{
  LogicalIndex idx;
  bool bVar1;
  int iVar2;
  string *column_name;
  undefined4 extraout_var;
  TableCatalogEntry *this_00;
  iterator iVar3;
  reference other;
  column_t column_index;
  LogicalType col_type;
  optional_ptr<duckdb::StandardEntry,_true> entry;
  ColumnBinding binding;
  Expression *local_110;
  LogicalIndex local_108;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_100;
  LogicalType local_f8;
  optional_ptr<duckdb::StandardEntry,_true> local_e0;
  idx_t local_d8;
  ColumnBinding local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ErrorData local_a0;
  
  local_d8 = depth;
  column_name = ColumnRefExpression::GetColumnName_abi_cxx11_(colref);
  bVar1 = Binding::TryGetBindingIndex(&this->super_Binding,column_name,&local_108.index);
  if (bVar1) {
    iVar2 = (*(this->super_Binding)._vptr_Binding[4])(this);
    idx.index = local_108.index;
    local_e0.ptr = (StandardEntry *)CONCAT44(extraout_var,iVar2);
    if (local_e0.ptr != (StandardEntry *)0x0) {
      bVar1 = IsVirtualColumn(local_108.index);
      if (!bVar1) {
        this_00 = (TableCatalogEntry *)
                  optional_ptr<duckdb::StandardEntry,_true>::operator->(&local_e0);
        TableCatalogEntry::GetColumn(this_00,idx);
      }
    }
    LogicalType::LogicalType(&local_f8);
    iVar3 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->virtual_columns)._M_h,&local_108.index);
    if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>.
        _M_cur == (__node_type *)0x0) {
      other = vector<duckdb::LogicalType,_true>::get<true>
                        (&(this->super_Binding).types,local_108.index);
      LogicalType::operator=(&local_f8,other);
      if ((colref->super_ParsedExpression).super_BaseExpression.alias._M_string_length == 0) {
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::get<true>(&(this->super_Binding).names,local_108.index);
        ::std::__cxx11::string::_M_assign
                  ((string *)&(colref->super_ParsedExpression).super_BaseExpression.alias);
      }
    }
    else {
      LogicalType::operator=
                (&local_f8,
                 (LogicalType *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                        ._M_cur + 0x30));
    }
    local_d0 = GetColumnBinding(this,local_108.index);
    (*(colref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_c0,colref);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&,unsigned_long&>
              ((duckdb *)&local_110,&local_c0,&local_f8,&local_d0,&local_d8);
    local_100._M_head_impl = local_110;
    local_110 = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_100);
    if (local_100._M_head_impl != (Expression *)0x0) {
      (*((local_100._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_100._M_head_impl = (Expression *)0x0;
    if (local_110 != (Expression *)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
    local_110 = (Expression *)0x0;
    ::std::__cxx11::string::~string((string *)&local_c0);
    LogicalType::~LogicalType(&local_f8);
  }
  else {
    (*(this->super_Binding)._vptr_Binding[2])(&local_a0,this,column_name);
    BindResult::BindResult(__return_storage_ptr__,&local_a0);
    ErrorData::~ErrorData(&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult TableBinding::Bind(ColumnRefExpression &colref, idx_t depth) {
	auto &column_name = colref.GetColumnName();
	column_t column_index;
	bool success = false;
	success = TryGetBindingIndex(column_name, column_index);
	if (!success) {
		return BindResult(ColumnNotFoundError(column_name));
	}
	auto entry = GetStandardEntry();
	if (entry && !IsVirtualColumn(column_index)) {
		D_ASSERT(entry->type == CatalogType::TABLE_ENTRY);
		// Either there is no table, or the columns category has to be standard
		auto &table_entry = entry->Cast<TableCatalogEntry>();
		auto &column_entry = table_entry.GetColumn(LogicalIndex(column_index));
		(void)table_entry;
		(void)column_entry;
		D_ASSERT(column_entry.Category() == TableColumnType::STANDARD);
	}
	// fetch the type of the column
	LogicalType col_type;
	auto ventry = virtual_columns.find(column_index);
	if (ventry != virtual_columns.end()) {
		// virtual column - fetch type from there
		col_type = ventry->second.type;
	} else {
		// normal column: fetch type from base column
		col_type = types[column_index];
		if (colref.GetAlias().empty()) {
			colref.SetAlias(names[column_index]);
		}
	}
	ColumnBinding binding = GetColumnBinding(column_index);
	return BindResult(make_uniq<BoundColumnRefExpression>(colref.GetName(), col_type, binding, depth));
}